

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load_data(section_impl<ELFIO::Elf32_Shdr> *this)

{
  address_translator *this_00;
  istream *piVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  unsigned_long uVar7;
  char *__p;
  pointer pcVar8;
  Elf_Xword EVar9;
  bool local_a1;
  fpos<__mbstate_t> local_58;
  ulong local_48;
  Elf_Xword size;
  streampos local_30;
  ulong local_20;
  Elf_Xword sh_offset;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  this_00 = this->translator;
  sh_offset = (Elf_Xword)this;
  uVar5 = endianness_convertor::operator()(this->convertor,(this->header).sh_offset);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&size,(ulong)uVar5);
  local_30 = address_translator::operator[](this_00,_size);
  local_20 = std::fpos::operator_cast_to_long((fpos *)&local_30);
  iVar6 = (*(this->super_section)._vptr_section[0x13])();
  uVar3 = local_20;
  local_48 = CONCAT44(extraout_var,iVar6);
  iVar6 = (*(this->super_section)._vptr_section[0x20])();
  uVar2 = local_48;
  if (CONCAT44(extraout_var_00,iVar6) < uVar3) {
    this_local._7_1_ = false;
  }
  else {
    iVar6 = (*(this->super_section)._vptr_section[0x20])();
    uVar3 = local_48;
    if ((CONCAT44(extraout_var_01,iVar6) < uVar2) ||
       (iVar6 = (*(this->super_section)._vptr_section[0x20])(),
       CONCAT44(extraout_var_02,iVar6) - local_20 < uVar3)) {
      this_local._7_1_ = false;
    }
    else {
      bVar4 = std::operator==((nullptr_t)0x0,&this->data);
      if (((bVar4) && (iVar6 = (*(this->super_section)._vptr_section[5])(), iVar6 != 0)) &&
         (iVar6 = (*(this->super_section)._vptr_section[5])(), uVar2 = local_48, iVar6 != 8)) {
        uVar7 = std::numeric_limits<unsigned_long>::max();
        if (uVar7 - 1 < uVar2) {
          this_local._7_1_ = false;
        }
        else {
          __p = (char *)operator_new__(local_48 + 1,(nothrow_t *)&std::nothrow);
          std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                    ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data,__p);
          if ((local_48 == 0) || (bVar4 = std::operator!=((nullptr_t)0x0,&this->data), !bVar4)) {
            this->data_size = 0;
            if (local_48 != 0) {
              return false;
            }
          }
          else {
            piVar1 = this->pstream;
            std::fpos<__mbstate_t>::fpos(&local_58,local_20);
            std::istream::seekg(piVar1,local_58._M_off,local_58._M_state);
            piVar1 = this->pstream;
            pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
            std::istream::read((char *)piVar1,(long)pcVar8);
            EVar9 = std::istream::gcount();
            if (EVar9 != local_48) {
              std::unique_ptr<char[],_std::default_delete<char[]>_>::reset
                        (&this->data,(nullptr_t)0x0);
              this->data_size = 0;
              return false;
            }
            this->data_size = local_48;
            pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
            pcVar8[local_48] = '\0';
          }
          this->is_loaded = true;
          this_local._7_1_ = true;
        }
      }
      else {
        bVar4 = std::operator!=((nullptr_t)0x0,&this->data);
        local_a1 = true;
        if (!bVar4) {
          iVar6 = (*(this->super_section)._vptr_section[5])();
          local_a1 = true;
          if (iVar6 != 0) {
            iVar6 = (*(this->super_section)._vptr_section[5])();
            local_a1 = iVar6 == 8;
          }
        }
        this->is_loaded = local_a1;
        this_local._7_1_ = (bool)(this->is_loaded & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool load_data() const
    {
        Elf_Xword sh_offset = (*translator)[(*convertor)(header.sh_offset)];
        Elf_Xword size = get_size();
        
        // Check for integer overflow in offset calculation
        if (sh_offset > get_stream_size()) {
            return false;
        }
        
        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - sh_offset)) {
            return false;
        }

        // Check if we need to load data
        if (nullptr == data && SHT_NULL != get_type() && SHT_NOBITS != get_type()) {
            // Check if size can be safely converted to size_t
            if (size > std::numeric_limits<size_t>::max() - 1) {
                return false;
            }
            
            data.reset(new (std::nothrow) char[size_t(size) + 1]);

            if ((0 != size) && (nullptr != data)) {
                pstream->seekg(sh_offset);
                pstream->read(data.get(), size);
                if (static_cast<Elf_Xword>(pstream->gcount()) != size) {
                    data.reset(nullptr);
                    data_size = 0;
                    return false;
                }

                data_size = size;
                data.get()[size] = 0; // Safe now as we allocated size + 1
            }
            else {
                data_size = 0;
                if (size != 0) {
                    return false; // Failed to allocate required memory
                }
            }
            
            is_loaded = true;
            return true;
        }

        // Data already loaded or doesn't need loading
        is_loaded = (nullptr != data) || (SHT_NULL == get_type()) || (SHT_NOBITS == get_type());
        return is_loaded;
    }